

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall QNetworkRequestPrivate::~QNetworkRequestPrivate(QNetworkRequestPrivate *this)

{
  long in_RDI;
  QNetworkHeadersPrivate *this_00;
  
  this_00 = *(QNetworkHeadersPrivate **)(in_RDI + 0x60);
  if (this_00 != (QNetworkHeadersPrivate *)0x0) {
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x1fc85f);
    operator_delete(this_00,8);
  }
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x1fc87e);
  QHttp1Configuration::~QHttp1Configuration((QHttp1Configuration *)(in_RDI + 0x88));
  QString::~QString((QString *)0x1fc89b);
  QUrl::~QUrl((QUrl *)(in_RDI + 0x50));
  QNetworkHeadersPrivate::~QNetworkHeadersPrivate(this_00);
  return;
}

Assistant:

~QNetworkRequestPrivate()
    {
#ifndef QT_NO_SSL
        delete sslConfiguration;
#endif
    }